

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rgbcx.h
# Opt level: O1

uint32_t rgbcx::bc1_find_sels3_fullerr
                   (bool use_black,color32 *pSrc_pixels,uint32_t lr,uint32_t lg,uint32_t lb,
                   uint32_t hr,uint32_t hg,uint32_t hb,uint8_t *sels,uint32_t cur_err)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  uint uVar4;
  uint8_t uVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  int iVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  long lVar23;
  uint uVar24;
  int iVar25;
  uint uVar26;
  bool bVar27;
  
  uVar21 = lr >> 2 | lr * 8;
  uVar6 = lg >> 4 | lg * 4;
  uVar10 = lb >> 2 | lb * 8;
  uVar11 = hr >> 2 | hr * 8;
  uVar19 = hg >> 4 | hg * 4;
  uVar12 = hb >> 2 | hb * 8;
  if (g_bc1_approx_mode != 3) {
    if (g_bc1_approx_mode == 2) {
      uVar8 = (int)(uVar11 + uVar21 + 1) >> 1;
      uVar18 = (int)(uVar19 + uVar6 + 1) >> 1;
      uVar20 = (int)(uVar12 + uVar10 + 1) >> 1;
      goto LAB_001204e8;
    }
    if (g_bc1_approx_mode != 0) {
      iVar7 = (hr + lr) * 0x21;
      iVar15 = (hr + lr) * 0x21 + 7;
      if (-1 < iVar7) {
        iVar15 = iVar7;
      }
      uVar8 = iVar15 >> 3;
      iVar15 = uVar19 - uVar6;
      iVar7 = iVar15 + 3;
      if (-1 < iVar15) {
        iVar7 = iVar15;
      }
      iVar7 = (iVar7 >> 2) + uVar6 * 0x100;
      iVar25 = iVar15 * 0x80 + iVar7 + 0x80;
      iVar7 = iVar7 + iVar15 * 0x80 + 0x17f;
      if (-1 < iVar25) {
        iVar7 = iVar25;
      }
      uVar18 = iVar7 >> 8;
      iVar7 = (hb + lb) * 0x21;
      iVar15 = (hb + lb) * 0x21 + 7;
      if (-1 < iVar7) {
        iVar15 = iVar7;
      }
      uVar20 = iVar15 >> 3;
      goto LAB_001204e8;
    }
  }
  uVar8 = uVar11 + uVar21 >> 1;
  uVar18 = uVar19 + uVar6 >> 1;
  uVar20 = uVar12 + uVar10 >> 1;
LAB_001204e8:
  lVar23 = 0;
  uVar4 = 0;
  while( true ) {
    bVar1 = pSrc_pixels[lVar23].field_0.field_0.r;
    bVar2 = pSrc_pixels[lVar23].field_0.field_0.g;
    bVar3 = pSrc_pixels[lVar23].field_0.field_0.b;
    iVar7 = uVar21 - bVar1;
    iVar15 = uVar6 - bVar2;
    iVar25 = uVar10 - bVar3;
    uVar26 = iVar25 * iVar25 + iVar15 * iVar15 + iVar7 * iVar7;
    iVar7 = uVar11 - bVar1;
    iVar15 = uVar19 - bVar2;
    iVar25 = uVar12 - bVar3;
    uVar24 = iVar25 * iVar25 + iVar15 * iVar15 + iVar7 * iVar7;
    uVar14 = uVar24;
    if (uVar24 >= uVar26) {
      uVar14 = uVar26;
    }
    uVar9 = (uint)bVar1;
    uVar22 = (uint)bVar2;
    uVar13 = (uint)bVar3;
    uVar16 = (uVar20 - uVar13) * (uVar20 - uVar13) +
             (uVar18 - uVar22) * (uVar18 - uVar22) + (uVar8 - uVar9) * (uVar8 - uVar9);
    uVar17 = uVar16;
    if (uVar14 <= uVar16) {
      uVar17 = uVar14;
    }
    uVar5 = uVar24 < uVar26;
    if (uVar14 > uVar16) {
      uVar5 = '\x02';
    }
    if (use_black) {
      uVar14 = uVar13 * uVar13 + uVar22 * uVar22 + uVar9 * uVar9;
      bVar27 = uVar14 < uVar17;
      if (bVar27) {
        uVar17 = uVar14;
      }
      if (bVar27) {
        uVar5 = '\x03';
      }
    }
    uVar4 = uVar4 + uVar17;
    if (cur_err <= uVar4) break;
    sels[lVar23] = uVar5;
    lVar23 = lVar23 + 1;
    if (lVar23 == 0x10) {
      return uVar4;
    }
  }
  return uVar4;
}

Assistant:

static inline uint32_t bc1_find_sels3_fullerr(bool use_black, const color32* pSrc_pixels, uint32_t lr, uint32_t lg, uint32_t lb, uint32_t hr, uint32_t hg, uint32_t hb, uint8_t sels[16], uint32_t cur_err)
	{
		uint32_t block_r[3], block_g[3], block_b[3];
		bc1_get_block_colors3(block_r, block_g, block_b, lr, lg, lb, hr, hg, hb);
								
		uint32_t total_err = 0;

		for (uint32_t i = 0; i < 16; i++)
		{
			const int r = pSrc_pixels[i].r;
			const int g = pSrc_pixels[i].g;
			const int b = pSrc_pixels[i].b;

			uint32_t best_err = squarei((int)block_r[0] - (int)r) + squarei((int)block_g[0] - (int)g) + squarei((int)block_b[0] - (int)b);
			uint32_t best_sel = 0;

			uint32_t err1 = squarei((int)block_r[1] - (int)r) + squarei((int)block_g[1] - (int)g) + squarei((int)block_b[1] - (int)b);
			if (err1 < best_err)
			{
				best_err = err1;
				best_sel = 1;
			}

			uint32_t err2 = squarei((int)block_r[2] - (int)r) + squarei((int)block_g[2] - (int)g) + squarei((int)block_b[2] - (int)b);
			if (err2 < best_err)
			{
				best_err = err2;
				best_sel = 2;
			}

			if (use_black)
			{
				uint32_t err3 = squarei(r) + squarei(g) + squarei(b);
				if (err3 < best_err)
				{
					best_err = err3;
					best_sel = 3;
				}
			}
			
			total_err += best_err;
			if (total_err >= cur_err)
				return total_err;
			
			sels[i] = (uint8_t)best_sel;
		}

		return total_err;
	}